

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O0

QToken * QToken::low_wildcard(uint8_t val)

{
  runtime_error *this;
  byte in_SIL;
  QToken *in_RDI;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  QToken *this_00;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  int local_38;
  size_type in_stack_ffffffffffffffd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1bf097);
  if ((in_SIL & 0xf) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"format of low_wildcard is be 0xX0");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
    in_stack_ffffffffffffffc7 = in_SIL | (byte)local_38;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this_00->opts_,(value_type *)in_stack_ffffffffffffffa8);
  }
  QToken(this_00,in_stack_ffffffffffffffa8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  return in_RDI;
}

Assistant:

QToken QToken::low_wildcard(uint8_t val) {
    std::vector<uint8_t> options;
    if ((val & 0x0F) != 0) {
        throw std::runtime_error("format of low_wildcard is be 0xX0");
    }
    options.reserve(16);
    for (int i = 0; i < 16; i++) {
        options.push_back(static_cast<uint8_t>(val | i));
    }
    return QToken(std::move(options));
}